

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strspn(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  char *zIn;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  jx9_value *pjVar7;
  ulong uVar8;
  anon_union_8_3_18420de5_for_x aVar9;
  int iLen;
  int iMasklen;
  char *zString;
  SyString sToken;
  int local_50;
  uint local_4c;
  char *local_48;
  SyString local_40;
  
  if (1 < nArg) {
    pcVar3 = jx9_value_to_string(*apArg,&local_50);
    local_48 = pcVar3;
    pcVar4 = jx9_value_to_string(apArg[1],(int *)&local_4c);
    if ((0 < local_50) && (0 < (int)local_4c)) {
      if (nArg == 2) {
LAB_00131c53:
        sVar2 = ExtractNonSpaceToken(&local_48,pcVar3 + local_50,&local_40);
        if (local_40.nByte == 0 || sVar2 != 0) {
          aVar9.rVal = 0.0;
        }
        else {
          pcVar3 = local_40.zString;
          if ((0 < (int)local_40.nByte) && (0 < (int)local_4c)) {
            do {
              uVar8 = 0;
              while (*pcVar3 != pcVar4[uVar8]) {
                uVar8 = uVar8 + 1;
                if (local_4c == uVar8) goto LAB_00131cbe;
              }
              pcVar3 = pcVar3 + 1;
            } while (pcVar3 < local_40.zString + (int)local_40.nByte);
          }
LAB_00131cbe:
          aVar9 = (anon_union_8_3_18420de5_for_x)(long)((int)pcVar3 - (int)local_40.zString);
        }
        pjVar7 = pCtx->pRet;
        jx9MemObjRelease(pjVar7);
        pjVar7->x = aVar9;
        goto LAB_00131b68;
      }
      pjVar7 = apArg[2];
      jx9MemObjToInteger(pjVar7);
      uVar5 = (uint)(pjVar7->x).iVal;
      if ((int)uVar5 < 0) {
        uVar6 = local_50 + uVar5;
        if (uVar6 != 0 && SCARRY4(local_50,uVar5) == (int)uVar6 < 0) {
          iVar1 = -uVar5;
          goto LAB_00131c1d;
        }
      }
      else {
        iVar1 = local_50 - uVar5;
        if (iVar1 != 0 && (int)uVar5 <= local_50) {
          uVar6 = uVar5 & 0x7fffffff;
LAB_00131c1d:
          pcVar3 = pcVar3 + uVar6;
          local_50 = iVar1;
          local_48 = pcVar3;
          if (3 < (uint)nArg) {
            pjVar7 = apArg[3];
            jx9MemObjToInteger(pjVar7);
            iVar1 = (int)(pjVar7->x).iVal;
            if (iVar1 < local_50 && 0 < iVar1) {
              local_50 = iVar1;
            }
          }
          goto LAB_00131c53;
        }
      }
    }
  }
  pjVar7 = pCtx->pRet;
  jx9MemObjRelease(pjVar7);
  (pjVar7->x).rVal = 0.0;
LAB_00131b68:
  pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_strspn(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zMask, *zEnd;
	int iMasklen, iLen;
	SyString sToken;
	int iCount = 0;
	int rc;
	if( nArg < 2 ){
		/* Missing agruments, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &iLen);
	/* Extract the mask */
	zMask = jx9_value_to_string(apArg[1], &iMasklen);
	if( iLen < 1 || iMasklen < 1 ){
		/* Nothing to process, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 ){
			const char *zBase = &zString[iLen + nOfft];
			if( zBase > zString ){
				iLen = (int)(&zString[iLen]-zBase);
				zString = zBase;	
			}else{
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}
		}else{
			if( nOfft >= iLen ){
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}else{
				/* Update offset */
				zString += nOfft;
				iLen -= nOfft;
			}
		}
		if( nArg > 3 ){
			int iUserlen;
			/* Extract the desired length */
			iUserlen = jx9_value_to_int(apArg[3]);
			if( iUserlen > 0 && iUserlen < iLen ){
				iLen = iUserlen;
			}
		}
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	/* Extract the first non-space token */
	rc = ExtractNonSpaceToken(&zString, zEnd, &sToken);
	if( rc == SXRET_OK && sToken.nByte > 0 ){
		/* Compare against the current mask */
		iCount = LongestStringMask(sToken.zString, (int)sToken.nByte, zMask, iMasklen);
	}
	/* Longest match */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}